

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O1

Dec_Edge_t Dec_FactorTrivialTree_rec(Dec_Graph_t *pFForm,Dec_Edge_t *peNodes,int nNodes,int fNodeOr)

{
  Dec_Node_t *pDVar1;
  size_t sVar2;
  Dec_Edge_t DVar3;
  Dec_Edge_t DVar4;
  Dec_Node_t *pDVar5;
  int iVar6;
  
  if (nNodes == 1) {
    DVar3 = *peNodes;
  }
  else {
    iVar6 = nNodes / 2;
    DVar3 = Dec_FactorTrivialTree_rec(pFForm,peNodes,iVar6,fNodeOr);
    DVar4 = Dec_FactorTrivialTree_rec(pFForm,peNodes + iVar6,nNodes - iVar6,fNodeOr);
    iVar6 = pFForm->nCap;
    if (fNodeOr == 0) {
      if (pFForm->nSize == iVar6) {
        sVar2 = (long)iVar6 * 0x30;
        if (pFForm->pNodes == (Dec_Node_t *)0x0) {
          pDVar5 = (Dec_Node_t *)malloc(sVar2);
        }
        else {
          pDVar5 = (Dec_Node_t *)realloc(pFForm->pNodes,sVar2);
        }
        pFForm->pNodes = pDVar5;
        pFForm->nCap = pFForm->nCap << 1;
      }
      pDVar1 = pFForm->pNodes;
      iVar6 = pFForm->nSize;
      pFForm->nSize = iVar6 + 1;
      pDVar5 = pDVar1 + iVar6;
      pDVar5->eEdge0 = (Dec_Edge_t)0x0;
      pDVar5->eEdge1 = (Dec_Edge_t)0x0;
      (pDVar5->field_2).pFunc = (void *)0x0;
      *(undefined8 *)&pDVar1[iVar6].field_0x10 = 0;
      pDVar1[iVar6].eEdge0 = DVar3;
      pDVar1[iVar6].eEdge1 = DVar4;
      *(uint *)&pDVar1[iVar6].field_0x10 = ((uint)DVar4 & 1) << 0x10 | ((uint)DVar3 & 1) << 0xf;
      DVar3 = (Dec_Edge_t)(pFForm->nSize * 2 + 0x7ffffffeU & 0x7ffffffe);
    }
    else {
      if (pFForm->nSize == iVar6) {
        sVar2 = (long)iVar6 * 0x30;
        if (pFForm->pNodes == (Dec_Node_t *)0x0) {
          pDVar5 = (Dec_Node_t *)malloc(sVar2);
        }
        else {
          pDVar5 = (Dec_Node_t *)realloc(pFForm->pNodes,sVar2);
        }
        pFForm->pNodes = pDVar5;
        pFForm->nCap = pFForm->nCap << 1;
      }
      pDVar1 = pFForm->pNodes;
      iVar6 = pFForm->nSize;
      pFForm->nSize = iVar6 + 1;
      pDVar5 = pDVar1 + iVar6;
      pDVar5->eEdge0 = (Dec_Edge_t)0x0;
      pDVar5->eEdge1 = (Dec_Edge_t)0x0;
      (pDVar5->field_2).pFunc = (void *)0x0;
      *(undefined8 *)&pDVar1[iVar6].field_0x10 = 0;
      *(uint *)&pDVar1[iVar6].field_0x10 =
           ((uint)DVar3 & 1) * 0x8000 + ((uint)DVar4 & 1) * 0x10000 + 0x4000;
      pDVar1[iVar6].eEdge0 = (Dec_Edge_t)((uint)DVar3 ^ 1);
      pDVar1[iVar6].eEdge1 = (Dec_Edge_t)((uint)DVar4 ^ 1);
      DVar3 = (Dec_Edge_t)((pFForm->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
    }
  }
  return DVar3;
}

Assistant:

Dec_Edge_t Dec_FactorTrivialTree_rec( Dec_Graph_t * pFForm, Dec_Edge_t * peNodes, int nNodes, int fNodeOr )
{
    Dec_Edge_t eNode1, eNode2;
    int nNodes1, nNodes2;

    if ( nNodes == 1 )
        return peNodes[0];

    // split the nodes into two parts
    nNodes1 = nNodes/2;
    nNodes2 = nNodes - nNodes1;
//    nNodes2 = nNodes/2;
//    nNodes1 = nNodes - nNodes2;

    // recursively construct the tree for the parts
    eNode1 = Dec_FactorTrivialTree_rec( pFForm, peNodes,           nNodes1, fNodeOr );
    eNode2 = Dec_FactorTrivialTree_rec( pFForm, peNodes + nNodes1, nNodes2, fNodeOr );

    if ( fNodeOr )
        return Dec_GraphAddNodeOr( pFForm, eNode1, eNode2 );
    else
        return Dec_GraphAddNodeAnd( pFForm, eNode1, eNode2 );
}